

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O3

void __thiscall
facenet::Inception_resnet_A(facenet *this,pBox *input,pBox *output,string *filepath,float scale)

{
  pointer pcVar1;
  pBox *outpBox;
  pBox *outpBox_00;
  pBox *outpBox_01;
  pBox *outpBox_02;
  pBox *outpBox_03;
  pBox *outpBox_04;
  pBox *output_00;
  pBox *outpBox_05;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  Weight *weight_05;
  Weight *weight_06;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  BN *var_03;
  BN *mean_03;
  BN *beta_03;
  BN *var_04;
  BN *mean_04;
  BN *beta_04;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  string local_218;
  mydataFmt *local_1f8;
  mydataFmt *local_1f0;
  mydataFmt *local_1e8;
  mydataFmt *local_1e0;
  mydataFmt *local_1d8;
  mydataFmt *local_1d0;
  mydataFmt *local_1c8;
  mydataFmt *local_1c0;
  mydataFmt *local_1b8;
  mydataFmt *local_1b0;
  mydataFmt *local_1a8;
  mydataFmt *local_1a0;
  mydataFmt *local_198;
  mydataFmt *local_190;
  mydataFmt *local_188;
  mydataFmt *local_180;
  mydataFmt *local_178;
  mydataFmt *local_170;
  mydataFmt *local_168;
  mydataFmt *local_160;
  mydataFmt *local_158;
  mydataFmt *local_150;
  mydataFmt *local_148;
  mydataFmt *local_140;
  mydataFmt *local_138;
  mydataFmt *pmStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  long dataNumber [28];
  
  outpBox = (pBox *)operator_new(0x38);
  (outpBox->super_String)._M_dataplus._M_p = (pointer)&(outpBox->super_String).field_2;
  (outpBox->super_String)._M_string_length = 0;
  (outpBox->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_00 = (pBox *)operator_new(0x38);
  (outpBox_00->super_String)._M_dataplus._M_p = (pointer)&(outpBox_00->super_String).field_2;
  (outpBox_00->super_String)._M_string_length = 0;
  (outpBox_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_01 = (pBox *)operator_new(0x38);
  (outpBox_01->super_String)._M_dataplus._M_p = (pointer)&(outpBox_01->super_String).field_2;
  (outpBox_01->super_String)._M_string_length = 0;
  (outpBox_01->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_02 = (pBox *)operator_new(0x38);
  (outpBox_02->super_String)._M_dataplus._M_p = (pointer)&(outpBox_02->super_String).field_2;
  (outpBox_02->super_String)._M_string_length = 0;
  (outpBox_02->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_03 = (pBox *)operator_new(0x38);
  (outpBox_03->super_String)._M_dataplus._M_p = (pointer)&(outpBox_03->super_String).field_2;
  (outpBox_03->super_String)._M_string_length = 0;
  (outpBox_03->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_04 = (pBox *)operator_new(0x38);
  (outpBox_04->super_String)._M_dataplus._M_p = (pointer)&(outpBox_04->super_String).field_2;
  (outpBox_04->super_String)._M_string_length = 0;
  (outpBox_04->super_String).field_2._M_local_buf[0] = '\0';
  output_00 = (pBox *)operator_new(0x38);
  (output_00->super_String)._M_dataplus._M_p = (pointer)&(output_00->super_String).field_2;
  (output_00->super_String)._M_string_length = 0;
  (output_00->super_String).field_2._M_local_buf[0] = '\0';
  outpBox_05 = (pBox *)operator_new(0x38);
  (outpBox_05->super_String)._M_dataplus._M_p = (pointer)&(outpBox_05->super_String).field_2;
  (outpBox_05->super_String)._M_string_length = 0;
  (outpBox_05->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  weight_05 = (Weight *)operator_new(0x38);
  weight_06 = (Weight *)operator_new(0x38);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  var_03 = (BN *)operator_new(0x10);
  mean_03 = (BN *)operator_new(0x10);
  beta_03 = (BN *)operator_new(0x10);
  var_04 = (BN *)operator_new(0x10);
  mean_04 = (BN *)operator_new(0x10);
  beta_04 = (BN *)operator_new(0x10);
  lVar2 = ConvAndFcInit(weight,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x20);
  lVar3 = ConvAndFcInit(weight_00,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0x20);
  lVar4 = ConvAndFcInit(weight_01,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(beta_01,mean_01,var_01,0x20);
  lVar5 = ConvAndFcInit(weight_02,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(beta_02,mean_02,var_02,0x20);
  lVar6 = ConvAndFcInit(weight_03,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(beta_03,mean_03,var_03,0x20);
  lVar7 = ConvAndFcInit(weight_04,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(beta_04,mean_04,var_04,0x20);
  lVar8 = ConvAndFcInit(weight_05,0x100,0x60,1,1,0,0,0,0,0);
  dataNumber[0x1a] = ConvAndFcInit(weight_06,0x100,0,0,0,0,0,0,0,0);
  dataNumber[1] = 0x20;
  dataNumber[2] = 0x20;
  dataNumber[3] = 0x20;
  dataNumber[5] = 0x20;
  dataNumber[6] = 0x20;
  dataNumber[7] = 0x20;
  dataNumber[9] = 0x20;
  dataNumber[10] = 0x20;
  dataNumber[0xb] = 0x20;
  dataNumber[0xd] = 0x20;
  dataNumber[0xe] = 0x20;
  dataNumber[0xf] = 0x20;
  dataNumber[0x11] = 0x20;
  dataNumber[0x12] = 0x20;
  dataNumber[0x13] = 0x20;
  dataNumber[0x15] = 0x20;
  dataNumber[0x16] = 0x20;
  dataNumber[0x17] = 0x20;
  dataNumber[0x19] = 0x100;
  dataNumber[0x1b] = 0;
  local_1f8 = weight->pdata;
  local_1f0 = beta->pdata;
  local_1e8 = mean->pdata;
  local_1e0 = var->pdata;
  local_1d8 = weight_00->pdata;
  local_1d0 = beta_00->pdata;
  local_1c8 = mean_00->pdata;
  local_1c0 = var_00->pdata;
  local_1b8 = weight_01->pdata;
  local_1b0 = beta_01->pdata;
  local_1a8 = mean_01->pdata;
  local_1a0 = var_01->pdata;
  local_198 = weight_02->pdata;
  local_190 = beta_02->pdata;
  local_188 = mean_02->pdata;
  local_180 = var_02->pdata;
  local_178 = weight_03->pdata;
  local_170 = beta_03->pdata;
  local_168 = mean_03->pdata;
  local_160 = var_03->pdata;
  local_158 = weight_04->pdata;
  local_150 = beta_04->pdata;
  local_148 = mean_04->pdata;
  local_140 = var_04->pdata;
  local_138 = weight_05->pdata;
  pmStack_130 = weight_05->pbias;
  local_128 = *(undefined4 *)&weight_06->pdata;
  uStack_124 = *(undefined4 *)((long)&weight_06->pdata + 4);
  uStack_120 = *(undefined4 *)&weight_06->pbias;
  uStack_11c = *(undefined4 *)((long)&weight_06->pbias + 4);
  pcVar1 = (filepath->_M_dataplus)._M_p;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  dataNumber[0] = lVar2;
  dataNumber[4] = lVar3;
  dataNumber[8] = lVar4;
  dataNumber[0xc] = lVar5;
  dataNumber[0x10] = lVar6;
  dataNumber[0x14] = lVar7;
  dataNumber[0x18] = lVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar1,pcVar1 + filepath->_M_string_length);
  readData(&local_218,dataNumber,&local_1f8,0x1c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  convolutionInit(weight,input,outpBox);
  convolution(weight,input,outpBox);
  BatchNorm(outpBox,beta,mean,var);
  relu(outpBox,weight->pbias);
  convolutionInit(weight_00,input,outpBox_00);
  convolution(weight_00,input,outpBox_00);
  BatchNorm(outpBox_00,beta_00,mean_00,var_00);
  relu(outpBox_00,weight_00->pbias);
  convolutionInit(weight_01,outpBox_00,outpBox_01);
  convolution(weight_01,outpBox_00,outpBox_01);
  BatchNorm(outpBox_01,beta_01,mean_01,var_01);
  relu(outpBox_01,weight_01->pbias);
  convolutionInit(weight_02,input,outpBox_02);
  convolution(weight_02,input,outpBox_02);
  BatchNorm(outpBox_02,beta_02,mean_02,var_02);
  relu(outpBox_02,weight_02->pbias);
  convolutionInit(weight_03,outpBox_02,outpBox_03);
  convolution(weight_03,outpBox_02,outpBox_03);
  BatchNorm(outpBox_03,beta_03,mean_03,var_03);
  relu(outpBox_03,weight_03->pbias);
  convolutionInit(weight_04,outpBox_03,outpBox_04);
  convolution(weight_04,outpBox_03,outpBox_04);
  BatchNorm(outpBox_04,beta_04,mean_04,var_04);
  relu(outpBox_04,weight_04->pbias);
  conv_mergeInit(output_00,outpBox,outpBox_01,outpBox_04,(pBox *)0x0);
  conv_merge(output_00,outpBox,outpBox_01,outpBox_04,(pBox *)0x0);
  convolutionInit(weight_05,output_00,outpBox_05);
  convolution(weight_05,output_00,outpBox_05);
  addbias(outpBox_05,weight_05->pbias);
  mulandaddInit(input,outpBox_05,output);
  mulandadd(input,outpBox_05,output,scale);
  relu(output,weight_06->pbias);
  freepBox(outpBox);
  freepBox(outpBox_00);
  freepBox(outpBox_01);
  freepBox(outpBox_02);
  freepBox(outpBox_03);
  freepBox(outpBox_04);
  freepBox(output_00);
  freepBox(outpBox_05);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeWeight(weight_05);
  freeWeight(weight_06);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  freeBN(var_03);
  freeBN(mean_03);
  freeBN(beta_03);
  freeBN(var_04);
  freeBN(mean_04);
  freeBN(beta_04);
  return;
}

Assistant:

void facenet::Inception_resnet_A(pBox *input, pBox *output, string filepath, float scale) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;
    pBox *conv7_out = new pBox;
    pBox *conv8_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;
    struct Weight *conv7_wb = new Weight;
    struct Weight *conv8_wb = new Weight;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;

    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;

    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;

    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;

    struct BN *conv5_var = new BN;
    struct BN *conv5_mean = new BN;
    struct BN *conv5_beta = new BN;

    struct BN *conv6_var = new BN;
    struct BN *conv6_mean = new BN;
    struct BN *conv6_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 32);

    long conv2 = ConvAndFcInit(conv2_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 32);
    long conv3 = ConvAndFcInit(conv3_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 32);

    long conv4 = ConvAndFcInit(conv4_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 32);
    long conv5 = ConvAndFcInit(conv5_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv5_beta, conv5_mean, conv5_var, 32);
    long conv6 = ConvAndFcInit(conv6_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv6_beta, conv6_mean, conv6_var, 32);

    long conv7 = ConvAndFcInit(conv7_wb, 256, 96, 1, 1, 0);

    long conv8 = ConvAndFcInit(conv8_wb, 256, 0, 0, 0, 0);

    long dataNumber[28] = {conv1, 32, 32, 32, conv2, 32, 32, 32, conv3, 32, 32, 32, conv4, 32, 32, 32,
                           conv5, 32, 32, 32, conv6, 32, 32, 32, conv7, 256, conv8, 0};

//    mydataFmt *pointTeam[28] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_var->pdata, conv5_mean->pdata, conv5_beta->pdata, \
//                            conv6_wb->pdata, conv6_var->pdata, conv6_mean->pdata, conv6_beta->pdata, \
//                            conv7_wb->pdata, conv7_wb->pbias, \
//                            conv8_wb->pdata, conv8_wb->pbias};
    mydataFmt *pointTeam[28] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_beta->pdata, conv5_mean->pdata, conv5_var->pdata, \
                            conv6_wb->pdata, conv6_beta->pdata, conv6_mean->pdata, conv6_var->pdata, \
                            conv7_wb->pdata, conv7_wb->pbias, \
                            conv8_wb->pdata, conv8_wb->pbias};

    readData(filepath, dataNumber, pointTeam, 28);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 35 x 35 x 32
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 35 x 35 x 32
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);
    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 35 x 35 x 32
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, input, conv4_out);
    //conv4 35 x 35 x 32
    convolution(conv4_wb, input, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);
    convolutionInit(conv5_wb, conv4_out, conv5_out);
    //conv5 35 x 35 x 32
    convolution(conv5_wb, conv4_out, conv5_out);
    BatchNorm(conv5_out, conv5_beta, conv5_mean, conv5_var);
    relu(conv5_out, conv5_wb->pbias);
    convolutionInit(conv6_wb, conv5_out, conv6_out);
    //conv6 35 x 35 x 32
    convolution(conv6_wb, conv5_out, conv6_out);
    BatchNorm(conv6_out, conv6_beta, conv6_mean, conv6_var);
    relu(conv6_out, conv6_wb->pbias);

    conv_mergeInit(conv7_out, conv1_out, conv3_out, conv6_out);
    //35 × 35 × 96
    conv_merge(conv7_out, conv1_out, conv3_out, conv6_out);

    convolutionInit(conv7_wb, conv7_out, conv8_out);
    //35*35*256
    convolution(conv7_wb, conv7_out, conv8_out);
    addbias(conv8_out, conv7_wb->pbias);

    mulandaddInit(input, conv8_out, output);
    mulandadd(input, conv8_out, output, scale);
    relu(output, conv8_wb->pbias);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);
    freepBox(conv7_out);
    freepBox(conv8_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);
    freeWeight(conv7_wb);
    freeWeight(conv8_wb);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);

    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);

    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);

    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);

    freeBN(conv5_var);
    freeBN(conv5_mean);
    freeBN(conv5_beta);

    freeBN(conv6_var);
    freeBN(conv6_mean);
    freeBN(conv6_beta);
}